

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O0

Vec_Int_t * Unm_ManFindUsedNodes(Vec_Int_t *vPairs,int nObjs)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  Vec_Str_t *p_00;
  int local_2c;
  int i;
  Vec_Str_t *vMarks;
  Vec_Int_t *vNodes;
  int nObjs_local;
  Vec_Int_t *vPairs_local;
  
  p = Vec_IntAlloc(1000);
  p_00 = Vec_StrStart(nObjs);
  local_2c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vPairs);
    if (iVar2 <= local_2c) break;
    iVar2 = Vec_IntEntry(vPairs,local_2c);
    Vec_StrWriteEntry(p_00,iVar2,'\x01');
    local_2c = local_2c + 3;
  }
  for (local_2c = 0; local_2c < nObjs; local_2c = local_2c + 1) {
    cVar1 = Vec_StrEntry(p_00,local_2c);
    if (cVar1 != '\0') {
      Vec_IntPush(p,local_2c);
    }
  }
  Vec_StrFree(p_00);
  uVar3 = Vec_IntSize(p);
  printf("The number of used nodes = %d\n",(ulong)uVar3);
  return p;
}

Assistant:

Vec_Int_t * Unm_ManFindUsedNodes( Vec_Int_t * vPairs, int nObjs )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Vec_Str_t * vMarks = Vec_StrStart( nObjs ); int i;
    for ( i = 0; i < Vec_IntSize(vPairs); i += 3 )
        Vec_StrWriteEntry( vMarks, Vec_IntEntry(vPairs, i), 1 );
    for ( i = 0; i < nObjs; i++ )
        if ( Vec_StrEntry( vMarks, i ) )
            Vec_IntPush( vNodes, i );
    Vec_StrFree( vMarks );
    printf( "The number of used nodes = %d\n", Vec_IntSize(vNodes) );
    return vNodes;
}